

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O0

void __thiscall
t_rb_generator::generate_process_function
          (t_rb_generator *this,t_service *tservice,t_function *tfunction)

{
  bool bVar1;
  uint uVar2;
  t_rb_ofstream *ptVar3;
  ostream *poVar4;
  string *psVar5;
  t_struct *ptVar6;
  size_type sVar7;
  t_type *ptVar8;
  reference pptVar9;
  string local_168;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_148
  ;
  t_field **local_140;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_138
  ;
  t_field **local_130;
  byte local_121;
  const_iterator cStack_120;
  bool first;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *arg_struct;
  const_iterator x_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *xceptions;
  t_struct *xs;
  string local_d0;
  undefined1 local_b0 [8];
  string resultname;
  string local_80;
  string local_60;
  undefined1 local_40 [8];
  string argsname;
  t_function *tfunction_local;
  t_service *tservice_local;
  t_rb_generator *this_local;
  
  argsname.field_2._8_8_ = tfunction;
  ptVar3 = t_rb_ofstream::indent(&this->f_service_);
  poVar4 = std::operator<<((ostream *)ptVar3,"def process_");
  psVar5 = t_function::get_name_abi_cxx11_((t_function *)argsname.field_2._8_8_);
  poVar4 = std::operator<<(poVar4,(string *)psVar5);
  poVar4 = std::operator<<(poVar4,"(seqid, iprot, oprot)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_rb_ofstream::indent_up(&this->f_service_);
  psVar5 = t_function::get_name_abi_cxx11_((t_function *)argsname.field_2._8_8_);
  std::__cxx11::string::string((string *)&local_80,(string *)psVar5);
  t_generator::capitalize(&local_60,(t_generator *)this,&local_80);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,"_args");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  psVar5 = t_function::get_name_abi_cxx11_((t_function *)argsname.field_2._8_8_);
  std::__cxx11::string::string((string *)&xs,(string *)psVar5);
  t_generator::capitalize(&local_d0,(t_generator *)this,(string *)&xs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 &local_d0,"_result");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&xs);
  ptVar3 = t_rb_ofstream::indent(&this->f_service_);
  poVar4 = std::operator<<((ostream *)ptVar3,"args = read_args(iprot, ");
  poVar4 = std::operator<<(poVar4,(string *)local_40);
  poVar4 = std::operator<<(poVar4,")");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  ptVar6 = t_function::get_xceptions((t_function *)argsname.field_2._8_8_);
  x_iter._M_current = (t_field **)t_struct::get_members(ptVar6);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     *)&arg_struct);
  bVar1 = t_function::is_oneway((t_function *)argsname.field_2._8_8_);
  if (!bVar1) {
    ptVar3 = t_rb_ofstream::indent(&this->f_service_);
    poVar4 = std::operator<<((ostream *)ptVar3,"result = ");
    poVar4 = std::operator<<(poVar4,(string *)local_b0);
    poVar4 = std::operator<<(poVar4,".new()");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  sVar7 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size
                    ((vector<t_field_*,_std::allocator<t_field_*>_> *)x_iter._M_current);
  if (sVar7 != 0) {
    ptVar3 = t_rb_ofstream::indent(&this->f_service_);
    poVar4 = std::operator<<((ostream *)ptVar3,"begin");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_rb_ofstream::indent_up(&this->f_service_);
  }
  ptVar6 = t_function::get_arglist((t_function *)argsname.field_2._8_8_);
  f_iter._M_current = (t_field **)t_struct::get_members(ptVar6);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&stack0xfffffffffffffee0);
  t_rb_ofstream::indent(&this->f_service_);
  bVar1 = t_function::is_oneway((t_function *)argsname.field_2._8_8_);
  if (!bVar1) {
    ptVar8 = t_function::get_returntype((t_function *)argsname.field_2._8_8_);
    uVar2 = (*(ptVar8->super_t_doc)._vptr_t_doc[4])();
    if ((uVar2 & 1) == 0) {
      std::operator<<((ostream *)&this->f_service_,"result.success = ");
    }
  }
  poVar4 = std::operator<<((ostream *)&this->f_service_,"@handler.");
  psVar5 = t_function::get_name_abi_cxx11_((t_function *)argsname.field_2._8_8_);
  poVar4 = std::operator<<(poVar4,(string *)psVar5);
  std::operator<<(poVar4,"(");
  local_121 = 1;
  local_130 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  cStack_120 = (const_iterator)local_130;
  while( true ) {
    local_138._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&stack0xfffffffffffffee0,&local_138);
    if (!bVar1) break;
    if ((local_121 & 1) == 0) {
      std::operator<<((ostream *)&this->f_service_,", ");
    }
    else {
      local_121 = 0;
    }
    poVar4 = std::operator<<((ostream *)&this->f_service_,"args.");
    pptVar9 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xfffffffffffffee0);
    psVar5 = t_field::get_name_abi_cxx11_(*pptVar9);
    std::operator<<(poVar4,(string *)psVar5);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&stack0xfffffffffffffee0);
  }
  poVar4 = std::operator<<((ostream *)&this->f_service_,")");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  bVar1 = t_function::is_oneway((t_function *)argsname.field_2._8_8_);
  if (!bVar1) {
    sVar7 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size
                      ((vector<t_field_*,_std::allocator<t_field_*>_> *)x_iter._M_current);
    if (sVar7 != 0) {
      t_rb_ofstream::indent_down(&this->f_service_);
      local_140 = (t_field **)
                  std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(x_iter._M_current);
      arg_struct = (t_struct *)local_140;
      while( true ) {
        local_148._M_current =
             (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(x_iter._M_current);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                            *)&arg_struct,&local_148);
        if (!bVar1) break;
        ptVar3 = t_rb_ofstream::indent(&this->f_service_);
        poVar4 = std::operator<<((ostream *)ptVar3,"rescue ");
        pptVar9 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                               *)&arg_struct);
        ptVar8 = t_field::get_type(*pptVar9);
        full_type_name_abi_cxx11_(&local_168,this,ptVar8);
        poVar4 = std::operator<<(poVar4,(string *)&local_168);
        poVar4 = std::operator<<(poVar4," => ");
        pptVar9 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                               *)&arg_struct);
        psVar5 = t_field::get_name_abi_cxx11_(*pptVar9);
        poVar4 = std::operator<<(poVar4,(string *)psVar5);
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_168);
        bVar1 = t_function::is_oneway((t_function *)argsname.field_2._8_8_);
        if (!bVar1) {
          t_rb_ofstream::indent_up(&this->f_service_);
          ptVar3 = t_rb_ofstream::indent(&this->f_service_);
          poVar4 = std::operator<<((ostream *)ptVar3,"result.");
          pptVar9 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                 *)&arg_struct);
          psVar5 = t_field::get_name_abi_cxx11_(*pptVar9);
          poVar4 = std::operator<<(poVar4,(string *)psVar5);
          poVar4 = std::operator<<(poVar4," = ");
          pptVar9 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                 *)&arg_struct);
          psVar5 = t_field::get_name_abi_cxx11_(*pptVar9);
          poVar4 = std::operator<<(poVar4,(string *)psVar5);
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          t_rb_ofstream::indent_down(&this->f_service_);
        }
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    *)&arg_struct);
      }
      ptVar3 = t_rb_ofstream::indent(&this->f_service_);
      poVar4 = std::operator<<((ostream *)ptVar3,"end");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
  }
  bVar1 = t_function::is_oneway((t_function *)argsname.field_2._8_8_);
  if (bVar1) {
    ptVar3 = t_rb_ofstream::indent(&this->f_service_);
    poVar4 = std::operator<<((ostream *)ptVar3,"return");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_rb_ofstream::indent_down(&this->f_service_);
    ptVar3 = t_rb_ofstream::indent(&this->f_service_);
    poVar4 = std::operator<<((ostream *)ptVar3,"end");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  else {
    ptVar3 = t_rb_ofstream::indent(&this->f_service_);
    poVar4 = std::operator<<((ostream *)ptVar3,"write_result(result, oprot, \'");
    psVar5 = t_function::get_name_abi_cxx11_((t_function *)argsname.field_2._8_8_);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    poVar4 = std::operator<<(poVar4,"\', seqid)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_rb_ofstream::indent_down(&this->f_service_);
    ptVar3 = t_rb_ofstream::indent(&this->f_service_);
    poVar4 = std::operator<<((ostream *)ptVar3,"end");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void t_rb_generator::generate_process_function(t_service* tservice, t_function* tfunction) {
  (void)tservice;
  // Open function
  f_service_.indent() << "def process_" << tfunction->get_name() << "(seqid, iprot, oprot)" << endl;
  f_service_.indent_up();

  string argsname = capitalize(tfunction->get_name()) + "_args";
  string resultname = capitalize(tfunction->get_name()) + "_result";

  f_service_.indent() << "args = read_args(iprot, " << argsname << ")" << endl;

  t_struct* xs = tfunction->get_xceptions();
  const std::vector<t_field*>& xceptions = xs->get_members();
  vector<t_field*>::const_iterator x_iter;

  // Declare result for non oneway function
  if (!tfunction->is_oneway()) {
    f_service_.indent() << "result = " << resultname << ".new()" << endl;
  }

  // Try block for a function with exceptions
  if (xceptions.size() > 0) {
    f_service_.indent() << "begin" << endl;
    f_service_.indent_up();
  }

  // Generate the function call
  t_struct* arg_struct = tfunction->get_arglist();
  const std::vector<t_field*>& fields = arg_struct->get_members();
  vector<t_field*>::const_iterator f_iter;

  f_service_.indent();
  if (!tfunction->is_oneway() && !tfunction->get_returntype()->is_void()) {
    f_service_ << "result.success = ";
  }
  f_service_ << "@handler." << tfunction->get_name() << "(";
  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
    } else {
      f_service_ << ", ";
    }
    f_service_ << "args." << (*f_iter)->get_name();
  }
  f_service_ << ")" << endl;

  if (!tfunction->is_oneway() && xceptions.size() > 0) {
    f_service_.indent_down();
    for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
      f_service_.indent() << "rescue " << full_type_name((*x_iter)->get_type()) << " => "
                          << (*x_iter)->get_name() << endl;
      if (!tfunction->is_oneway()) {
        f_service_.indent_up();
        f_service_.indent() << "result." << (*x_iter)->get_name() << " = " << (*x_iter)->get_name()
                            << endl;
        f_service_.indent_down();
      }
    }
    f_service_.indent() << "end" << endl;
  }

  // Shortcut out here for oneway functions
  if (tfunction->is_oneway()) {
    f_service_.indent() << "return" << endl;
    f_service_.indent_down();
    f_service_.indent() << "end" << endl << endl;
    return;
  }

  f_service_.indent() << "write_result(result, oprot, '" << tfunction->get_name() << "', seqid)"
                      << endl;

  // Close function
  f_service_.indent_down();
  f_service_.indent() << "end" << endl << endl;
}